

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
PathTracer::ExtractColorImage(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  element_type *peVar1;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *access_queues;
  element_type *this_00;
  ulong __n;
  reference pvVar2;
  Ptr<Device> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  int i;
  float *data;
  shared_ptr<myvk::Buffer> staging_buffer;
  uint32_t kSize;
  vector<float,_std::allocator<float>_> *pixels;
  shared_ptr<myvk::BufferBase> *in_stack_00000200;
  shared_ptr<myvk::ImageBase> *in_stack_00000208;
  shared_ptr<myvk::CommandPool> *in_stack_00000210;
  shared_ptr<myvk::Buffer> *__r;
  shared_ptr<myvk::BufferBase> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  value_type vVar3;
  undefined4 in_stack_ffffffffffffff14;
  vector<float,_std::allocator<float>_> *this_01;
  undefined8 in_stack_ffffffffffffff40;
  VmaMemoryUsage memory_usage;
  vector<float,_std::allocator<float>_> *size;
  uint local_88;
  vector<float,_std::allocator<float>_> local_82 [2];
  shared_ptr<myvk::Buffer> local_48;
  undefined8 local_38;
  uint local_1c;
  
  memory_usage = (VmaMemoryUsage)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_1c = *(int *)&in_RSI[0x1a].super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi *
             *(int *)((long)&in_RSI[0x1a].
                             super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4);
  size = in_RDI;
  peVar1 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x171d9c);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  access_queues =
       (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
       ((ulong)(local_1c << 2) << 2);
  local_48.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_48.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  __r = &local_48;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x171de9);
  myvk::Buffer::Create
            (in_RSI,(VkDeviceSize)size,(VmaAllocationCreateFlags)((ulong)in_RDI >> 0x20),
             (VkBufferUsageFlags)in_RDI,memory_usage,access_queues);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)in_stack_ffffffffffffff00,(shared_ptr<myvk::Image> *)__r
            );
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>(in_stack_ffffffffffffff00,__r);
  extract_target_image_to_buffer(in_stack_00000210,in_stack_00000208,in_stack_00000200);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x171e93);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x171ea0);
  this_00 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x171ead);
  local_82[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _2_8_ = myvk::Buffer::GetMappedData(this_00);
  local_82[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._1_1_ = 0;
  __n = (ulong)(local_1c * 3);
  this_01 = local_82;
  std::allocator<float>::allocator((allocator<float> *)0x171ef4);
  std::vector<float,_std::allocator<float>_>::vector
            (this_01,__n,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::allocator<float>::~allocator((allocator<float> *)local_82);
  for (local_88 = 0; local_88 < local_1c; local_88 = local_88 + 1) {
    vVar3 = *(value_type *)
             (local_82[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._2_8_ + (long)(int)(local_88 << 2) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_RDI,(long)(int)(local_88 * 3));
    *pvVar2 = vVar3;
    vVar3 = *(value_type *)
             (local_82[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._2_8_ + (long)(int)(local_88 * 4 + 1) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_RDI,(long)(int)(local_88 * 3 + 1));
    *pvVar2 = vVar3;
    vVar3 = *(value_type *)
             (local_82[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._2_8_ + (long)(int)(local_88 * 4 + 2) * 4);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_RDI,(long)(int)(local_88 * 3 + 2));
    *pvVar2 = vVar3;
  }
  local_82[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._1_1_ = 1;
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x1720d3);
  return size;
}

Assistant:

std::vector<float> PathTracer::ExtractColorImage(const std::shared_ptr<myvk::CommandPool> &command_pool) const {
	const uint32_t kSize = m_width * m_height;
	std::shared_ptr<myvk::Buffer> staging_buffer =
	    myvk::Buffer::Create(command_pool->GetDevicePtr(), kSize * 4 * sizeof(float),
	                         VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT,
	                         VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	extract_target_image_to_buffer(command_pool, m_color_image, staging_buffer);

	auto *data = (float *)staging_buffer->GetMappedData();
	std::vector<float> pixels(kSize * 3);
	for (int i = 0; i < kSize; ++i) {
		pixels[i * 3 + 0] = data[i * 4 + 0];
		pixels[i * 3 + 1] = data[i * 4 + 1];
		pixels[i * 3 + 2] = data[i * 4 + 2];
	}

	return pixels;
}